

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O0

GraphNode * raviX_add_node(Graph *g,nodeId_t index)

{
  GraphNode *n;
  nodeId_t index_local;
  Graph *g_local;
  
  if ((index < g->allocated) && (g->nodes[index] != (GraphNode *)0x0)) {
    g_local = (Graph *)g->nodes[index];
  }
  else {
    if (g->allocated <= index) {
      raviX_graph_grow(g,index);
    }
    if (g->allocated <= index) {
      __assert_fail("index < g->allocated",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                    ,199,"GraphNode *raviX_add_node(Graph *, nodeId_t)");
    }
    g_local = (Graph *)(*g->node_allocator->calloc)(g->node_allocator->arena,1,0x30);
    if (((GraphNode *)g_local)->pre != 0) {
      __assert_fail("n->pre == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                    ,0xc9,"GraphNode *raviX_add_node(Graph *, nodeId_t)");
    }
    if (((GraphNode *)g_local)->rpost != 0) {
      __assert_fail("n->rpost == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                    ,0xca,"GraphNode *raviX_add_node(Graph *, nodeId_t)");
    }
    node_list_init(&((GraphNode *)g_local)->preds);
    node_list_init(&((GraphNode *)g_local)->succs);
    ((GraphNode *)g_local)->index = index;
    g->nodes[index] = (GraphNode *)g_local;
  }
  return (GraphNode *)g_local;
}

Assistant:

static GraphNode *raviX_add_node(Graph *g, nodeId_t index)
{
	if (index < g->allocated && g->nodes[index] != NULL) {
		// already allocated
		return g->nodes[index];
	}
	if (index >= g->allocated) {
		raviX_graph_grow(g, index);
	}
	assert(index < g->allocated);
	GraphNode *n = (GraphNode *) g->node_allocator->calloc(g->node_allocator->arena, 1, sizeof(GraphNode));
	assert(n->pre == 0);
	assert(n->rpost == 0);
	node_list_init(&n->preds);
	node_list_init(&n->succs);
	/* note that each node must have an index such that n = nodes[index] */
	n->index = index;
	g->nodes[index] = n;
	return n;
}